

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::lang_error::~lang_error(lang_error *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~lang_error() = default;